

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  float *pfVar7;
  double *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double in_XMM0_Qa;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [64];
  double in_XMM1_Qa;
  undefined1 auVar15 [16];
  float in_XMM2_Da;
  double *in_stack_00000008;
  float grab_pos;
  float grab_t;
  double v_new_off_round;
  double v_new_off_floor;
  double v_new_off_f;
  float a_1;
  float a;
  double v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  double linear_dist_max_to_0;
  double linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  double v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  double in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  double local_118;
  undefined3 in_stack_fffffffffffffef4;
  uint3 uVar16;
  uint uVar17;
  undefined1 uVar18;
  ImGuiInputReadMode in_stack_fffffffffffffef8;
  ImGuiNavDirSourceFlags in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  double in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  ImGuiDataType in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float fStack_dc;
  ImVec2 local_d8;
  float local_a0;
  float local_9c;
  float fStack_98;
  float local_90;
  bool local_89;
  float local_78;
  float local_5c;
  undefined1 extraout_var [56];
  float slow_factor;
  
  pIVar4 = GImGui;
  uVar6 = (uint)((in_R9D & 1) != 0);
  uVar17 = CONCAT13(1,in_stack_fffffffffffffef4);
  if (in_EDX != 8) {
    uVar17 = CONCAT13(in_EDX == 9,in_stack_fffffffffffffef4);
  }
  uVar18 = (undefined1)(uVar17 >> 0x18);
  uVar16 = (uint3)(ushort)uVar17;
  if ((in_XMM2_Da != 1.0) || (NAN(in_XMM2_Da))) {
    uVar16 = CONCAT12(uVar18,(ushort)uVar17);
  }
  slow_factor = (float)CONCAT13(uVar18,uVar16);
  fVar8 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar6);
  fVar9 = ImVec2::operator[](in_RDI,(long)(int)uVar6);
  fVar9 = (fVar8 - fVar9) - 4.0;
  local_5c = (pIVar4->Style).GrabMinSize;
  if (in_XMM1_Qa <= in_XMM0_Qa) {
    local_118 = in_XMM0_Qa - in_XMM1_Qa;
  }
  else {
    local_118 = in_XMM1_Qa - in_XMM0_Qa;
  }
  local_9c = in_stack_fffffffffffffec8;
  if (((uVar17 & 0x1000000) == 0) && (0.0 <= local_118)) {
    local_5c = ImMax<float>((float)((double)fVar9 / (local_118 + 1.0)),(pIVar4->Style).GrabMinSize);
    local_9c = in_stack_fffffffffffffec8;
  }
  fVar10 = ImMin<float>(local_5c,fVar9);
  fVar11 = ImVec2::operator[](in_RDI,(long)(int)uVar6);
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar10),
                           ZEXT416((uint)(fVar11 + 2.0)));
  fVar11 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar6);
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)-fVar10),
                           ZEXT416((uint)(fVar11 - 2.0)));
  if (((uVar16 & 0x10000) == 0) || (0.0 <= in_XMM0_Qa * in_XMM1_Qa)) {
    in_stack_fffffffffffffed0 = 0;
    in_stack_fffffffffffffed4 = 1.0;
    local_78 = in_stack_fffffffffffffed4;
    if (0.0 <= in_XMM0_Qa) {
      in_stack_fffffffffffffed4 = 0.0;
      local_78 = in_stack_fffffffffffffed4;
    }
  }
  else {
    dVar12 = ImPow((double)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffeb8);
    dVar13 = ImPow((double)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffeb8);
    local_78 = (float)(dVar12 / (dVar12 + dVar13));
  }
  local_89 = false;
  if (pIVar4->ActiveId == in_ESI) {
    bVar5 = false;
    local_90 = 0.0;
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar4->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar7 = ImVec2::operator[](&(pIVar4->IO).MousePos,(long)(int)uVar6);
        if (fVar9 - fVar10 <= 0.0) {
          in_stack_fffffffffffffecc = 0.0;
        }
        else {
          in_stack_fffffffffffffecc =
               ImClamp<float>((*pfVar7 - auVar2._0_4_) / (fVar9 - fVar10),0.0,1.0);
        }
        local_90 = in_stack_fffffffffffffecc;
        if (uVar6 == 1) {
          local_90 = 1.0 - in_stack_fffffffffffffecc;
        }
        bVar5 = true;
      }
    }
    else if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      auVar14._0_8_ =
           GetNavInputAmount2d(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,slow_factor,fVar8
                              );
      auVar14._8_56_ = extraout_var;
      uVar1 = vmovlpd_avx(auVar14._0_16_);
      if (uVar6 == 0) {
        local_9c = (float)uVar1;
      }
      else {
        fStack_98 = (float)((ulong)uVar1 >> 0x20);
        local_9c = -fStack_98;
      }
      if ((pIVar4->NavActivatePressedId == in_ESI) && ((pIVar4->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((local_9c != 0.0) || (NAN(local_9c))) {
        fVar8 = local_9c;
        local_90 = SliderCalcRatioFromValueT<double,double>
                             ((ImGuiDataType)in_stack_ffffffffffffff20,
                              (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                              in_stack_ffffffffffffff00);
        if ((uVar17 & 0x1000000) == 0) {
          in_stack_fffffffffffffec4 = 0.0;
        }
        else {
          in_stack_fffffffffffffec4 =
               (float)ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_fffffffffffffecc,fVar8),
                                 (int)in_stack_fffffffffffffec4);
        }
        if (((int)in_stack_fffffffffffffec4 < 1) && ((uVar16 & 0x10000) == 0)) {
          if (((-100.0 <= local_118) && (local_118 <= 100.0)) ||
             (bVar5 = IsNavInputDown(0xe), bVar5)) {
            uVar1 = vcmpss_avx512f(ZEXT416((uint)local_9c),(undefined1  [16])0x0,1);
            bVar5 = (bool)((byte)uVar1 & 1);
            local_a0 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * 0x3f800000) /
                       (float)local_118;
          }
          else {
            local_a0 = local_9c / 100.0;
          }
        }
        else {
          local_a0 = local_9c / 100.0;
          bVar5 = IsNavInputDown(0xe);
          if (bVar5) {
            local_a0 = local_a0 / 10.0;
          }
        }
        bVar5 = IsNavInputDown(0xf);
        if (bVar5) {
          local_a0 = local_a0 * 10.0;
        }
        bVar5 = true;
        if (((1.0 <= local_90) && (0.0 < local_a0)) || ((local_90 <= 0.0 && (local_a0 < 0.0)))) {
          bVar5 = false;
          local_9c = fVar8;
        }
        else {
          local_90 = ImSaturate(local_90 + local_a0);
          local_9c = fVar8;
        }
      }
    }
    if (bVar5) {
      if ((uVar16 & 0x10000) == 0) {
        if ((uVar17 & 0x1000000) != 0) {
          ImLerp<double>(in_XMM0_Qa,in_XMM1_Qa,local_90);
        }
      }
      else if (local_78 <= local_90) {
        auVar15._8_4_ = 0x7fffffff;
        auVar15._0_8_ = 0x7fffffff7fffffff;
        auVar15._12_4_ = 0x7fffffff;
        vpand_avx(ZEXT416((uint)(local_78 - 1.0)),auVar15);
        fVar8 = ImPow(0.0,6.722324e-39);
        dVar12 = ImMax<double>(in_XMM0_Qa,0.0);
        ImLerp<double>(dVar12,in_XMM1_Qa,fVar8);
      }
      else {
        fVar8 = ImPow(0.0,6.72204e-39);
        dVar12 = ImMin<double>(in_XMM1_Qa,0.0);
        ImLerp<double>(dVar12,in_XMM0_Qa,fVar8);
      }
      dVar12 = RoundScalarWithFormatT<double,double>
                         ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
      if ((*in_RCX != dVar12) || (NAN(*in_RCX) || NAN(dVar12))) {
        *in_RCX = dVar12;
        local_89 = true;
      }
    }
  }
  if (1.0 <= fVar9) {
    fVar9 = SliderCalcRatioFromValueT<double,double>
                      ((ImGuiDataType)in_stack_ffffffffffffff20,
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                      );
    if (uVar6 == 1) {
      fVar9 = 1.0 - fVar9;
    }
    fVar9 = ImLerp<float>(auVar2._0_4_,auVar3._0_4_,fVar9);
    if (uVar6 == 0) {
      vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)-fVar10),ZEXT416((uint)fVar9));
      vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar10),ZEXT416((uint)fVar9));
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,local_9c,in_stack_fffffffffffffec4,
                     in_stack_fffffffffffffec0);
      *in_stack_00000008 = in_stack_ffffffffffffff08;
      in_stack_00000008[1] = (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    }
    else {
      vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)-fVar10),ZEXT416((uint)fVar9));
      vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar10),ZEXT416((uint)fVar9));
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,local_9c,in_stack_fffffffffffffec4,
                     in_stack_fffffffffffffec0);
      *in_stack_00000008 = (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
      in_stack_00000008[1] = (double)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
    }
  }
  else {
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff20,in_RDI,in_RDI);
    *in_stack_00000008 = (double)CONCAT44(fStack_dc,in_stack_ffffffffffffff20);
    *(ImVec2 *)(in_stack_00000008 + 1) = local_d8;
  }
  return local_89;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}